

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_subtract_sse2.c
# Opt level: O0

void subtract_8x8(int16_t *diff,ptrdiff_t diff_stride,uint16_t *src,ptrdiff_t src_stride,
                 uint16_t *pred,ptrdiff_t pred_stride)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 *puVar33;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  long in_R9;
  __m128i v7;
  __m128i v6;
  __m128i v5;
  __m128i v4;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  __m128i v0;
  __m128i u7;
  __m128i u6;
  __m128i u5;
  __m128i u4;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  short local_268;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  short sStack_25a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  __m128i x7;
  __m128i x6;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  
  uVar1 = *in_RDX;
  uVar2 = in_RDX[1];
  puVar33 = (undefined8 *)((long)in_RDX + in_RCX * 2);
  uVar3 = *puVar33;
  uVar4 = puVar33[1];
  puVar33 = (undefined8 *)((long)in_RDX + in_RCX * 4);
  uVar5 = *puVar33;
  uVar6 = puVar33[1];
  puVar33 = (undefined8 *)((long)in_RDX + in_RCX * 6);
  uVar7 = *puVar33;
  uVar8 = puVar33[1];
  uVar9 = in_RDX[in_RCX];
  uVar10 = (in_RDX + in_RCX)[1];
  puVar33 = (undefined8 *)((long)in_RDX + in_RCX * 10);
  uVar11 = *puVar33;
  uVar12 = puVar33[1];
  puVar33 = (undefined8 *)((long)in_RDX + in_RCX * 0xc);
  uVar13 = *puVar33;
  uVar14 = puVar33[1];
  puVar33 = (undefined8 *)((long)in_RDX + in_RCX * 0xe);
  uVar15 = *puVar33;
  uVar16 = puVar33[1];
  uVar17 = *in_R8;
  uVar18 = in_R8[1];
  puVar33 = (undefined8 *)((long)in_R8 + in_R9 * 2);
  uVar19 = *puVar33;
  uVar20 = puVar33[1];
  puVar33 = (undefined8 *)((long)in_R8 + in_R9 * 4);
  uVar21 = *puVar33;
  uVar22 = puVar33[1];
  puVar33 = (undefined8 *)((long)in_R8 + in_R9 * 6);
  uVar23 = *puVar33;
  uVar24 = puVar33[1];
  uVar25 = in_R8[in_R9];
  uVar26 = (in_R8 + in_R9)[1];
  puVar33 = (undefined8 *)((long)in_R8 + in_R9 * 10);
  uVar27 = *puVar33;
  uVar28 = puVar33[1];
  puVar33 = (undefined8 *)((long)in_R8 + in_R9 * 0xc);
  uVar29 = *puVar33;
  uVar30 = puVar33[1];
  puVar33 = (undefined8 *)((long)in_R8 + in_R9 * 0xe);
  uVar31 = *puVar33;
  uVar32 = puVar33[1];
  local_188 = (short)uVar1;
  sStack_186 = (short)((ulong)uVar1 >> 0x10);
  sStack_184 = (short)((ulong)uVar1 >> 0x20);
  sStack_182 = (short)((ulong)uVar1 >> 0x30);
  sStack_180 = (short)uVar2;
  sStack_17e = (short)((ulong)uVar2 >> 0x10);
  sStack_17c = (short)((ulong)uVar2 >> 0x20);
  sStack_17a = (short)((ulong)uVar2 >> 0x30);
  local_198 = (short)uVar17;
  sStack_196 = (short)((ulong)uVar17 >> 0x10);
  sStack_194 = (short)((ulong)uVar17 >> 0x20);
  sStack_192 = (short)((ulong)uVar17 >> 0x30);
  sStack_190 = (short)uVar18;
  sStack_18e = (short)((ulong)uVar18 >> 0x10);
  sStack_18c = (short)((ulong)uVar18 >> 0x20);
  sStack_18a = (short)((ulong)uVar18 >> 0x30);
  local_1a8 = (short)uVar3;
  sStack_1a6 = (short)((ulong)uVar3 >> 0x10);
  sStack_1a4 = (short)((ulong)uVar3 >> 0x20);
  sStack_1a2 = (short)((ulong)uVar3 >> 0x30);
  sStack_1a0 = (short)uVar4;
  sStack_19e = (short)((ulong)uVar4 >> 0x10);
  sStack_19c = (short)((ulong)uVar4 >> 0x20);
  sStack_19a = (short)((ulong)uVar4 >> 0x30);
  local_1b8 = (short)uVar19;
  sStack_1b6 = (short)((ulong)uVar19 >> 0x10);
  sStack_1b4 = (short)((ulong)uVar19 >> 0x20);
  sStack_1b2 = (short)((ulong)uVar19 >> 0x30);
  sStack_1b0 = (short)uVar20;
  sStack_1ae = (short)((ulong)uVar20 >> 0x10);
  sStack_1ac = (short)((ulong)uVar20 >> 0x20);
  sStack_1aa = (short)((ulong)uVar20 >> 0x30);
  local_1c8 = (short)uVar5;
  sStack_1c6 = (short)((ulong)uVar5 >> 0x10);
  sStack_1c4 = (short)((ulong)uVar5 >> 0x20);
  sStack_1c2 = (short)((ulong)uVar5 >> 0x30);
  sStack_1c0 = (short)uVar6;
  sStack_1be = (short)((ulong)uVar6 >> 0x10);
  sStack_1bc = (short)((ulong)uVar6 >> 0x20);
  sStack_1ba = (short)((ulong)uVar6 >> 0x30);
  local_1d8 = (short)uVar21;
  sStack_1d6 = (short)((ulong)uVar21 >> 0x10);
  sStack_1d4 = (short)((ulong)uVar21 >> 0x20);
  sStack_1d2 = (short)((ulong)uVar21 >> 0x30);
  sStack_1d0 = (short)uVar22;
  sStack_1ce = (short)((ulong)uVar22 >> 0x10);
  sStack_1cc = (short)((ulong)uVar22 >> 0x20);
  sStack_1ca = (short)((ulong)uVar22 >> 0x30);
  local_1e8 = (short)uVar7;
  sStack_1e6 = (short)((ulong)uVar7 >> 0x10);
  sStack_1e4 = (short)((ulong)uVar7 >> 0x20);
  sStack_1e2 = (short)((ulong)uVar7 >> 0x30);
  sStack_1e0 = (short)uVar8;
  sStack_1de = (short)((ulong)uVar8 >> 0x10);
  sStack_1dc = (short)((ulong)uVar8 >> 0x20);
  sStack_1da = (short)((ulong)uVar8 >> 0x30);
  local_1f8 = (short)uVar23;
  sStack_1f6 = (short)((ulong)uVar23 >> 0x10);
  sStack_1f4 = (short)((ulong)uVar23 >> 0x20);
  sStack_1f2 = (short)((ulong)uVar23 >> 0x30);
  sStack_1f0 = (short)uVar24;
  sStack_1ee = (short)((ulong)uVar24 >> 0x10);
  sStack_1ec = (short)((ulong)uVar24 >> 0x20);
  sStack_1ea = (short)((ulong)uVar24 >> 0x30);
  local_208 = (short)uVar9;
  sStack_206 = (short)((ulong)uVar9 >> 0x10);
  sStack_204 = (short)((ulong)uVar9 >> 0x20);
  sStack_202 = (short)((ulong)uVar9 >> 0x30);
  sStack_200 = (short)uVar10;
  sStack_1fe = (short)((ulong)uVar10 >> 0x10);
  sStack_1fc = (short)((ulong)uVar10 >> 0x20);
  sStack_1fa = (short)((ulong)uVar10 >> 0x30);
  local_218 = (short)uVar25;
  sStack_216 = (short)((ulong)uVar25 >> 0x10);
  sStack_214 = (short)((ulong)uVar25 >> 0x20);
  sStack_212 = (short)((ulong)uVar25 >> 0x30);
  sStack_210 = (short)uVar26;
  sStack_20e = (short)((ulong)uVar26 >> 0x10);
  sStack_20c = (short)((ulong)uVar26 >> 0x20);
  sStack_20a = (short)((ulong)uVar26 >> 0x30);
  local_228 = (short)uVar11;
  sStack_226 = (short)((ulong)uVar11 >> 0x10);
  sStack_224 = (short)((ulong)uVar11 >> 0x20);
  sStack_222 = (short)((ulong)uVar11 >> 0x30);
  sStack_220 = (short)uVar12;
  sStack_21e = (short)((ulong)uVar12 >> 0x10);
  sStack_21c = (short)((ulong)uVar12 >> 0x20);
  sStack_21a = (short)((ulong)uVar12 >> 0x30);
  local_238 = (short)uVar27;
  sStack_236 = (short)((ulong)uVar27 >> 0x10);
  sStack_234 = (short)((ulong)uVar27 >> 0x20);
  sStack_232 = (short)((ulong)uVar27 >> 0x30);
  sStack_230 = (short)uVar28;
  sStack_22e = (short)((ulong)uVar28 >> 0x10);
  sStack_22c = (short)((ulong)uVar28 >> 0x20);
  sStack_22a = (short)((ulong)uVar28 >> 0x30);
  local_248 = (short)uVar13;
  sStack_246 = (short)((ulong)uVar13 >> 0x10);
  sStack_244 = (short)((ulong)uVar13 >> 0x20);
  sStack_242 = (short)((ulong)uVar13 >> 0x30);
  sStack_240 = (short)uVar14;
  sStack_23e = (short)((ulong)uVar14 >> 0x10);
  sStack_23c = (short)((ulong)uVar14 >> 0x20);
  sStack_23a = (short)((ulong)uVar14 >> 0x30);
  local_258 = (short)uVar29;
  sStack_256 = (short)((ulong)uVar29 >> 0x10);
  sStack_254 = (short)((ulong)uVar29 >> 0x20);
  sStack_252 = (short)((ulong)uVar29 >> 0x30);
  sStack_250 = (short)uVar30;
  sStack_24e = (short)((ulong)uVar30 >> 0x10);
  sStack_24c = (short)((ulong)uVar30 >> 0x20);
  sStack_24a = (short)((ulong)uVar30 >> 0x30);
  local_268 = (short)uVar15;
  sStack_266 = (short)((ulong)uVar15 >> 0x10);
  sStack_264 = (short)((ulong)uVar15 >> 0x20);
  sStack_262 = (short)((ulong)uVar15 >> 0x30);
  sStack_260 = (short)uVar16;
  sStack_25e = (short)((ulong)uVar16 >> 0x10);
  sStack_25c = (short)((ulong)uVar16 >> 0x20);
  sStack_25a = (short)((ulong)uVar16 >> 0x30);
  local_278 = (short)uVar31;
  sStack_276 = (short)((ulong)uVar31 >> 0x10);
  sStack_274 = (short)((ulong)uVar31 >> 0x20);
  sStack_272 = (short)((ulong)uVar31 >> 0x30);
  sStack_270 = (short)uVar32;
  sStack_26e = (short)((ulong)uVar32 >> 0x10);
  sStack_26c = (short)((ulong)uVar32 >> 0x20);
  sStack_26a = (short)((ulong)uVar32 >> 0x30);
  *in_RDI = CONCAT26(sStack_182 - sStack_192,
                     CONCAT24(sStack_184 - sStack_194,
                              CONCAT22(sStack_186 - sStack_196,local_188 - local_198)));
  in_RDI[1] = CONCAT26(sStack_17a - sStack_18a,
                       CONCAT24(sStack_17c - sStack_18c,
                                CONCAT22(sStack_17e - sStack_18e,sStack_180 - sStack_190)));
  puVar33 = (undefined8 *)((long)in_RDI + in_RSI * 2);
  *puVar33 = CONCAT26(sStack_1a2 - sStack_1b2,
                      CONCAT24(sStack_1a4 - sStack_1b4,
                               CONCAT22(sStack_1a6 - sStack_1b6,local_1a8 - local_1b8)));
  puVar33[1] = CONCAT26(sStack_19a - sStack_1aa,
                        CONCAT24(sStack_19c - sStack_1ac,
                                 CONCAT22(sStack_19e - sStack_1ae,sStack_1a0 - sStack_1b0)));
  puVar33 = (undefined8 *)((long)in_RDI + in_RSI * 4);
  *puVar33 = CONCAT26(sStack_1c2 - sStack_1d2,
                      CONCAT24(sStack_1c4 - sStack_1d4,
                               CONCAT22(sStack_1c6 - sStack_1d6,local_1c8 - local_1d8)));
  puVar33[1] = CONCAT26(sStack_1ba - sStack_1ca,
                        CONCAT24(sStack_1bc - sStack_1cc,
                                 CONCAT22(sStack_1be - sStack_1ce,sStack_1c0 - sStack_1d0)));
  puVar33 = (undefined8 *)((long)in_RDI + in_RSI * 6);
  *puVar33 = CONCAT26(sStack_1e2 - sStack_1f2,
                      CONCAT24(sStack_1e4 - sStack_1f4,
                               CONCAT22(sStack_1e6 - sStack_1f6,local_1e8 - local_1f8)));
  puVar33[1] = CONCAT26(sStack_1da - sStack_1ea,
                        CONCAT24(sStack_1dc - sStack_1ec,
                                 CONCAT22(sStack_1de - sStack_1ee,sStack_1e0 - sStack_1f0)));
  in_RDI[in_RSI] =
       CONCAT26(sStack_202 - sStack_212,
                CONCAT24(sStack_204 - sStack_214,
                         CONCAT22(sStack_206 - sStack_216,local_208 - local_218)));
  (in_RDI + in_RSI)[1] =
       CONCAT26(sStack_1fa - sStack_20a,
                CONCAT24(sStack_1fc - sStack_20c,
                         CONCAT22(sStack_1fe - sStack_20e,sStack_200 - sStack_210)));
  puVar33 = (undefined8 *)((long)in_RDI + in_RSI * 10);
  *puVar33 = CONCAT26(sStack_222 - sStack_232,
                      CONCAT24(sStack_224 - sStack_234,
                               CONCAT22(sStack_226 - sStack_236,local_228 - local_238)));
  puVar33[1] = CONCAT26(sStack_21a - sStack_22a,
                        CONCAT24(sStack_21c - sStack_22c,
                                 CONCAT22(sStack_21e - sStack_22e,sStack_220 - sStack_230)));
  puVar33 = (undefined8 *)((long)in_RDI + in_RSI * 0xc);
  *puVar33 = CONCAT26(sStack_242 - sStack_252,
                      CONCAT24(sStack_244 - sStack_254,
                               CONCAT22(sStack_246 - sStack_256,local_248 - local_258)));
  puVar33[1] = CONCAT26(sStack_23a - sStack_24a,
                        CONCAT24(sStack_23c - sStack_24c,
                                 CONCAT22(sStack_23e - sStack_24e,sStack_240 - sStack_250)));
  puVar33 = (undefined8 *)((long)in_RDI + in_RSI * 0xe);
  *puVar33 = CONCAT26(sStack_262 - sStack_272,
                      CONCAT24(sStack_264 - sStack_274,
                               CONCAT22(sStack_266 - sStack_276,local_268 - local_278)));
  puVar33[1] = CONCAT26(sStack_25a - sStack_26a,
                        CONCAT24(sStack_25c - sStack_26c,
                                 CONCAT22(sStack_25e - sStack_26e,sStack_260 - sStack_270)));
  return;
}

Assistant:

static void subtract_8x8(int16_t *diff, ptrdiff_t diff_stride,
                         const uint16_t *src, ptrdiff_t src_stride,
                         const uint16_t *pred, ptrdiff_t pred_stride) {
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;

  u0 = _mm_loadu_si128((__m128i const *)(src + 0 * src_stride));
  u1 = _mm_loadu_si128((__m128i const *)(src + 1 * src_stride));
  u2 = _mm_loadu_si128((__m128i const *)(src + 2 * src_stride));
  u3 = _mm_loadu_si128((__m128i const *)(src + 3 * src_stride));
  u4 = _mm_loadu_si128((__m128i const *)(src + 4 * src_stride));
  u5 = _mm_loadu_si128((__m128i const *)(src + 5 * src_stride));
  u6 = _mm_loadu_si128((__m128i const *)(src + 6 * src_stride));
  u7 = _mm_loadu_si128((__m128i const *)(src + 7 * src_stride));

  v0 = _mm_loadu_si128((__m128i const *)(pred + 0 * pred_stride));
  v1 = _mm_loadu_si128((__m128i const *)(pred + 1 * pred_stride));
  v2 = _mm_loadu_si128((__m128i const *)(pred + 2 * pred_stride));
  v3 = _mm_loadu_si128((__m128i const *)(pred + 3 * pred_stride));
  v4 = _mm_loadu_si128((__m128i const *)(pred + 4 * pred_stride));
  v5 = _mm_loadu_si128((__m128i const *)(pred + 5 * pred_stride));
  v6 = _mm_loadu_si128((__m128i const *)(pred + 6 * pred_stride));
  v7 = _mm_loadu_si128((__m128i const *)(pred + 7 * pred_stride));

  x0 = _mm_sub_epi16(u0, v0);
  x1 = _mm_sub_epi16(u1, v1);
  x2 = _mm_sub_epi16(u2, v2);
  x3 = _mm_sub_epi16(u3, v3);
  x4 = _mm_sub_epi16(u4, v4);
  x5 = _mm_sub_epi16(u5, v5);
  x6 = _mm_sub_epi16(u6, v6);
  x7 = _mm_sub_epi16(u7, v7);

  _mm_storeu_si128((__m128i *)(diff + 0 * diff_stride), x0);
  _mm_storeu_si128((__m128i *)(diff + 1 * diff_stride), x1);
  _mm_storeu_si128((__m128i *)(diff + 2 * diff_stride), x2);
  _mm_storeu_si128((__m128i *)(diff + 3 * diff_stride), x3);
  _mm_storeu_si128((__m128i *)(diff + 4 * diff_stride), x4);
  _mm_storeu_si128((__m128i *)(diff + 5 * diff_stride), x5);
  _mm_storeu_si128((__m128i *)(diff + 6 * diff_stride), x6);
  _mm_storeu_si128((__m128i *)(diff + 7 * diff_stride), x7);
}